

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O2

void __thiscall gv_visitor::visit(gv_visitor *this,IntValue *ptr)

{
  ostream *this_00;
  stringstream local_1c0 [8];
  stringstream stream;
  ostream local_1b0 [376];
  string local_38;
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  this_00 = std::operator<<(local_1b0,"int: ");
  std::ostream::operator<<(this_00,ptr->value);
  std::__cxx11::stringbuf::str();
  box(this,ptr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return;
}

Assistant:

void gv_visitor::visit(IntValue* ptr) {
    std::stringstream stream;
    stream << "int: " << ptr->value;
    box(ptr, stream.str());
    //value(int)
}